

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * __thiscall
httplib::detail::make_content_range_header_field_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,pair<long,_long> *range,size_t content_length
          )

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  pair<long,_long> *ppVar6;
  uint uVar7;
  char cVar8;
  ulong uVar9;
  string __str;
  long *local_60;
  uint local_58;
  long local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  pair<long,_long> *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bytes ","");
  uVar1 = *(ulong *)this;
  if (uVar1 != 0xffffffffffffffff) {
    uVar9 = -uVar1;
    if (0 < (long)uVar1) {
      uVar9 = uVar1;
    }
    uVar7 = 1;
    if (9 < uVar9) {
      uVar5 = uVar9;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        if (uVar5 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0013a2d8;
        }
        if (uVar5 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0013a2d8;
        }
        if (uVar5 < 10000) goto LAB_0013a2d8;
        bVar2 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar3 = uVar7 + 4;
      } while (bVar2);
      uVar7 = uVar7 + 1;
    }
LAB_0013a2d8:
    local_60 = local_50;
    local_38 = range;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar7 - (char)((long)uVar1 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_60 - ((long)uVar1 >> 0x3f)),uVar7,uVar9);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
    range = local_38;
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar1 = *(ulong *)(this + 8);
  if (uVar1 != 0xffffffffffffffff) {
    uVar9 = -uVar1;
    if (0 < (long)uVar1) {
      uVar9 = uVar1;
    }
    uVar7 = 1;
    if (9 < uVar9) {
      uVar5 = uVar9;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        if (uVar5 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0013a3bf;
        }
        if (uVar5 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0013a3bf;
        }
        if (uVar5 < 10000) goto LAB_0013a3bf;
        bVar2 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar3 = uVar7 + 4;
      } while (bVar2);
      uVar7 = uVar7 + 1;
    }
LAB_0013a3bf:
    local_60 = local_50;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar7 - (char)((long)uVar1 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_60 - ((long)uVar1 >> 0x3f)),uVar7,uVar9);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar8 = '\x01';
  if ((pair<long,_long> *)0x9 < range) {
    ppVar6 = range;
    cVar4 = '\x04';
    do {
      cVar8 = cVar4;
      if (ppVar6 < (pair<long,_long> *)0x64) {
        cVar8 = cVar8 + -2;
        goto LAB_0013a484;
      }
      if (ppVar6 < (pair<long,_long> *)0x3e8) {
        cVar8 = cVar8 + -1;
        goto LAB_0013a484;
      }
      if (ppVar6 < (pair<long,_long> *)0x2710) goto LAB_0013a484;
      bVar2 = (pair<long,_long> *)0x1869f < ppVar6;
      ppVar6 = (pair<long,_long> *)((ulong)ppVar6 / 10000);
      cVar4 = cVar8 + '\x04';
    } while (bVar2);
    cVar8 = cVar8 + '\x01';
  }
LAB_0013a484:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,(unsigned_long)range);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
make_content_range_header_field(const std::pair<ssize_t, ssize_t> &range,
                                size_t content_length) {
  std::string field = "bytes ";
  if (range.first != -1) { field += std::to_string(range.first); }
  field += "-";
  if (range.second != -1) { field += std::to_string(range.second); }
  field += "/";
  field += std::to_string(content_length);
  return field;
}